

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModportNamedPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportNamedPortSyntax,slang::syntax::ModportNamedPortSyntax_const&>
          (BumpAllocator *this,ModportNamedPortSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ModportNamedPortSyntax *pMVar8;
  
  pMVar8 = (ModportNamedPortSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)&(args->super_ModportPortSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ModportPortSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ModportPortSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->name).kind;
  uVar5 = (args->name).field_0x2;
  NVar6.raw = (args->name).numFlags.raw;
  uVar7 = (args->name).rawLen;
  (pMVar8->super_ModportPortSyntax).super_SyntaxNode.kind =
       (args->super_ModportPortSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar8->super_ModportPortSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pMVar8->super_ModportPortSyntax).super_SyntaxNode.parent = pSVar1;
  (pMVar8->super_ModportPortSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pMVar8->name).kind = TVar4;
  (pMVar8->name).field_0x2 = uVar5;
  (pMVar8->name).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar8->name).rawLen = uVar7;
  (pMVar8->name).info = (args->name).info;
  return pMVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }